

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

address __thiscall pstore::database::allocate(database *this,uint64_t bytes,uint align)

{
  bool bVar1;
  uint64_t uVar2;
  value_type vVar3;
  unsigned_long uVar4;
  uint64_t new_logical_size;
  uint64_t result;
  uint64_t extra_for_alignment;
  uint64_t local_30;
  uint64_t old_logical_size;
  uint64_t uStack_20;
  uint align_local;
  uint64_t bytes_local;
  database *this_local;
  
  old_logical_size._4_4_ = align;
  uStack_20 = bytes;
  bytes_local = (uint64_t)this;
  bVar1 = is_power_of_two<unsigned_int,std::enable_if<true,void>>(align);
  if (!bVar1) {
    assert_failed("is_power_of_two (align)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                  ,0x19c);
  }
  if ((this->closed_ & 1U) != 0) {
    raise<pstore::error_code>(store_closed);
  }
  this->modified_ = true;
  uVar2 = sizes::logical_size(&this->size_);
  local_30 = uVar2;
  extra_for_alignment = (uint64_t)sizes::footer_pos(&this->size_);
  vVar3 = typed_address<pstore::trailer>::absolute
                    ((typed_address<pstore::trailer> *)&extra_for_alignment);
  if (uVar2 < vVar3 + 0x70) {
    assert_failed("old_logical_size >= size_.footer_pos ().absolute () + sizeof (trailer)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                  ,0x1a3);
  }
  uVar4 = calc_alignment<unsigned_long>(local_30,(ulong)old_logical_size._4_4_);
  if (uVar4 < old_logical_size._4_4_) {
    vVar3 = local_30 + uVar4;
    uVar2 = vVar3 + uStack_20;
    storage::map_bytes(&this->storage_,local_30,uVar2);
    sizes::update_logical_size(&this->size_,uVar2);
    address::address((address *)&this_local,vVar3);
    return (address)(value_type)this_local;
  }
  assert_failed("extra_for_alignment < align",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0x1a6);
}

Assistant:

pstore::address database::allocate (std::uint64_t const bytes, unsigned const align) {
        PSTORE_ASSERT (is_power_of_two (align));
        if (closed_) {
            raise (error_code::store_closed);
        }
        modified_ = true;

        std::uint64_t const old_logical_size = size_.logical_size ();
        PSTORE_ASSERT (old_logical_size >= size_.footer_pos ().absolute () + sizeof (trailer));
        std::uint64_t const extra_for_alignment =
            calc_alignment (old_logical_size, std::uint64_t{align});
        PSTORE_ASSERT (extra_for_alignment < align);
        // Bump 'result' up by the number of alignment bytes that we're adding to ensure
        // that it's properly aligned.
        std::uint64_t const result = old_logical_size + extra_for_alignment;

        // Increase the number of bytes being requested by enough to ensure that result is
        // properly aligned.
        std::uint64_t const new_logical_size = result + bytes;

        // Memory map additional space if necessary.
        storage_.map_bytes (old_logical_size, new_logical_size);

        size_.update_logical_size (new_logical_size);
        if /*constexpr*/ (
            database::small_files_enabled ()) { //! OCLINT(PH - don't warn that this is a constant)
            this->file ()->truncate (new_logical_size);
        }
        return address{result};
    }